

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64_speed.c
# Opt level: O0

int main(int argc,char **argv)

{
  test_base64_speed();
  return 0;
}

Assistant:

int
main(int argc, char **argv) {
    test_base64_speed();
    return 0;
}